

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-perf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  reference pvVar5;
  long lVar6;
  reference puVar7;
  ulong uVar8;
  long in_RSI;
  int in_EDI;
  size_t quantized_size_4;
  anon_class_32_4_7807d5e0 quantize_fn_4;
  size_t size_5;
  iterator __end4_4;
  iterator __begin4_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_4;
  size_t quantized_size_3;
  anon_class_32_4_0d8592bc quantize_fn_3;
  size_t size_4;
  iterator __end4_3;
  iterator __begin4_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_3;
  size_t quantized_size_2;
  anon_class_32_4_aacd4656 quantize_fn_2;
  size_t size_3;
  iterator __end4_2;
  iterator __begin4_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_2;
  size_t quantized_size_1;
  anon_class_32_4_0d8592bc quantize_fn_1;
  size_t size_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_1;
  size_t quantized_size;
  anon_class_32_4_cebba3c5 quantize_fn;
  size_t size_1;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  ggml_type_traits_cpu *qfns_cpu;
  ggml_type_traits *qfns;
  ggml_type type;
  int i_1;
  ggml_context *ctx;
  ggml_init_params ggml_params;
  int64_t iterations;
  float *test_out;
  float *test_q2;
  float *test_q1;
  float *test_data2;
  float *test_data1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_out_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q2_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_q1_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data2_v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_data1_v;
  size_t largest;
  int number;
  int alignment;
  string op;
  size_t size;
  int i;
  string arg;
  bool invalid_param;
  quantize_perf_params params;
  undefined4 in_stack_fffffffffffff868;
  undefined4 uVar9;
  int in_stack_fffffffffffff86c;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff874;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff878;
  anon_class_32_4_cebba3c5 *__f;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff880;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff888;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff890;
  allocator<char> *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  float fVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b0;
  float in_stack_fffffffffffff8d8;
  float in_stack_fffffffffffff8dc;
  unsigned_long in_stack_fffffffffffff8e0;
  size_t in_stack_fffffffffffff8e8;
  size_t in_stack_fffffffffffff8f0;
  float local_6f4;
  float local_6c4;
  float local_694;
  bool local_661;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4b8;
  undefined1 *local_4b0;
  undefined8 local_488;
  long **local_480;
  void **local_478;
  void **local_470;
  unsigned_long *local_468;
  unsigned_long local_460;
  unsigned_long *local_458;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_450;
  undefined1 *local_448;
  size_t local_420;
  long *local_418;
  void **local_410;
  void **local_408;
  unsigned_long *local_400;
  unsigned_long local_3f8;
  unsigned_long *local_3f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e8;
  undefined1 *local_3e0;
  undefined8 local_3b8;
  long **local_3b0;
  void **local_3a8;
  void **local_3a0;
  unsigned_long *local_398;
  unsigned_long local_390;
  unsigned_long *local_388;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_380;
  undefined1 *local_378;
  undefined8 local_350;
  long *local_348;
  void **local_340;
  void **local_338;
  unsigned_long *local_330;
  unsigned_long local_328;
  unsigned_long *local_320;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_318;
  undefined1 *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  undefined8 local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  long *local_2e0;
  long local_2d8;
  int local_2d0;
  int local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  size_t local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  void *local_270;
  void *local_268 [21];
  value_type local_1c0;
  unsigned_long *local_1b8;
  unsigned_long *local_1b0;
  undefined8 local_1a8;
  allocator<char> local_199;
  string local_198 [32];
  int local_178;
  allocator<char> local_171;
  string local_170 [32];
  int local_150;
  allocator<char> local_149;
  string local_148 [32];
  int local_128;
  allocator<char> local_121;
  string local_120 [32];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  allocator<char> local_c1;
  string local_c0 [32];
  ulong local_a0;
  int local_84;
  string local_80 [39];
  byte local_59;
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  long local_28;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  size_t local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_58,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10748a);
  memset(local_40,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1074b7);
  local_28 = 0;
  local_20 = 0;
  local_1f = 0;
  local_1e = 0;
  local_1d = 0;
  local_1c = 0;
  local_18 = 10;
  local_59 = 0;
  std::__cxx11::string::string(local_80);
  local_84 = 1;
  do {
    if (local_8 <= local_84) {
LAB_00108018:
      pFVar1 = _stderr;
      if ((local_59 & 1) == 0) {
        bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff880._M_current);
        if (bVar2) {
          local_1a8 = 0x1000;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        }
        if (((((local_20 & 1) == 0) && ((local_1f & 1) == 0)) && ((local_1e & 1) == 0)) &&
           (((local_1d & 1) == 0 && ((local_1c & 1) == 0)))) {
          local_1c = 1;
          local_1d = 1;
          local_1e = 1;
          local_1f = 1;
          local_20 = 1;
        }
        local_1b0 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        local_1b8 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )in_stack_fffffffffffff880._M_current,in_stack_fffffffffffff878);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        local_1c0 = *pvVar5;
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x108199);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888._M_current,
                   (allocator_type *)in_stack_fffffffffffff880._M_current);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1081c5);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1081f2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888._M_current,
                   (allocator_type *)in_stack_fffffffffffff880._M_current);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x10821e);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10824b);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888._M_current,
                   (allocator_type *)in_stack_fffffffffffff880._M_current);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x108277);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1082a4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888._M_current,
                   (allocator_type *)in_stack_fffffffffffff880._M_current);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1082d0);
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1082fd);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888._M_current,
                   (allocator_type *)in_stack_fffffffffffff880._M_current);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x108329);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x108336);
        local_268[0] = align_with_offset((void *)CONCAT44(in_stack_fffffffffffff874,
                                                          in_stack_fffffffffffff870),
                                         in_stack_fffffffffffff86c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10836c);
        local_270 = align_with_offset((void *)CONCAT44(in_stack_fffffffffffff874,
                                                       in_stack_fffffffffffff870),
                                      in_stack_fffffffffffff86c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1083a2);
        local_278 = align_with_offset((void *)CONCAT44(in_stack_fffffffffffff874,
                                                       in_stack_fffffffffffff870),
                                      in_stack_fffffffffffff86c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1083d8);
        local_280 = align_with_offset((void *)CONCAT44(in_stack_fffffffffffff874,
                                                       in_stack_fffffffffffff870),
                                      in_stack_fffffffffffff86c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10840e);
        local_288 = align_with_offset((void *)CONCAT44(in_stack_fffffffffffff874,
                                                       in_stack_fffffffffffff870),
                                      in_stack_fffffffffffff86c);
        generate_data((float)((ulong)in_stack_fffffffffffff880._M_current >> 0x20),
                      (size_t)in_stack_fffffffffffff878._M_current,
                      (float *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        generate_data((float)((ulong)in_stack_fffffffffffff880._M_current >> 0x20),
                      (size_t)in_stack_fffffffffffff878._M_current,
                      (float *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
        local_290 = local_18;
        local_298 = 1;
        local_2a8 = 0x400;
        uStack_2a0 = 0;
        local_2b8 = 1;
        local_2c8 = 0x400;
        uStack_2c0 = 0;
        __f = (anon_class_32_4_cebba3c5 *)0x1;
        local_2c8._0_4_ = 0x400;
        local_2c8._4_4_ = 0;
        uStack_2c0._0_4_ = 0;
        uStack_2c0._4_4_ = 0;
        uVar9 = (undefined4)local_2c8;
        uVar10 = local_2c8._4_4_;
        in_stack_fffffffffffff870 = (undefined4)uStack_2c0;
        in_stack_fffffffffffff874 = uStack_2c0._4_4_;
        local_2b0 = ggml_init();
        for (local_2cc = 0; local_2cc < 0x27; local_2cc = local_2cc + 1) {
          local_2d0 = local_2cc;
          local_2d8 = ggml_get_type_traits(local_2cc);
          local_2e0 = (long *)ggml_get_type_traits_cpu(local_2d0);
          bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff880._M_current);
          local_661 = false;
          if (!bVar2) {
            lVar6 = ggml_type_name(local_2d0);
            local_661 = false;
            if (lVar6 != 0) {
              local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT44(uVar10,uVar9));
              local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT44(uVar10,uVar9));
              local_300 = ggml_type_name(local_2d0);
              local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                                    (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                                     (char **)__f);
              local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)CONCAT44(uVar10,uVar9));
              local_661 = __gnu_cxx::operator==
                                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870
                                                ),
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(uVar10,uVar9));
            }
          }
          if (((local_661 == false) && (*local_2e0 != 0)) && (*(long *)(local_2d8 + 0x28) != 0)) {
            uVar4 = ggml_type_name(local_2d0);
            printf("%s\n",uVar4);
            ggml_quantize_init(local_2d0);
            if ((local_20 & 1) != 0) {
              printf("  quantize_row_q_reference\n");
              local_310 = local_40;
              local_318._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT44(uVar10,uVar9));
              local_320 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(uVar10,uVar9));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(uVar10,uVar9)), bVar2) {
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_318);
                local_328 = *puVar7;
                uVar8 = local_328 << 2;
                local_694 = (float)(uVar8 >> 1) + (float)(uVar8 >> 1);
                if (-1 < (long)uVar8) {
                  local_694 = (float)(long)uVar8;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(local_694 * 9.536743e-07),0),
                       local_328);
                local_348 = &local_2d8;
                local_340 = local_268;
                local_338 = &local_278;
                local_330 = &local_328;
                local_350 = ggml_row_size(local_2d0,local_328);
                std::function<float()>::function<main::__0&,void>
                          ((function<float_()> *)in_stack_fffffffffffff880._M_current,__f);
                benchmark_function(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                   in_stack_fffffffffffff8e0,
                                   (function<float_()> *)
                                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
                std::function<float_()>::~function((function<float_()> *)0x1089c6);
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_318);
              }
              printf("\n");
            }
            if ((local_1f & 1) != 0) {
              printf("  quantize_row_q\n");
              local_378 = local_40;
              local_380._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT44(uVar10,uVar9));
              local_388 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(uVar10,uVar9));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(uVar10,uVar9)), bVar2) {
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_380);
                local_390 = *puVar7;
                uVar8 = local_390 << 2;
                local_6c4 = (float)(uVar8 >> 1) + (float)(uVar8 >> 1);
                if (-1 < (long)uVar8) {
                  local_6c4 = (float)(long)uVar8;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(local_6c4 * 9.536743e-07),0),
                       local_390);
                local_3b0 = &local_2e0;
                local_3a8 = local_268;
                local_3a0 = &local_278;
                local_398 = &local_390;
                local_3b8 = ggml_row_size(local_2d0,local_390);
                std::function<float()>::function<main::__1&,void>
                          ((function<float_()> *)in_stack_fffffffffffff880._M_current,
                           (anon_class_32_4_0d8592bc *)__f);
                benchmark_function(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                   in_stack_fffffffffffff8e0,
                                   (function<float_()> *)
                                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
                std::function<float_()>::~function((function<float_()> *)0x108c0d);
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_380);
              }
              printf("\n");
            }
            if ((local_1e & 1) != 0) {
              printf("  dequantize_row_q\n");
              (*(code *)*local_2e0)(local_268[0],local_278,local_1c0);
              local_3e0 = local_40;
              local_3e8._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT44(uVar10,uVar9));
              local_3f0 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(uVar10,uVar9));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(uVar10,uVar9)), bVar2) {
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_3e8);
                local_3f8 = *puVar7;
                uVar8 = local_3f8 << 2;
                local_6f4 = (float)(uVar8 >> 1) + (float)(uVar8 >> 1);
                if (-1 < (long)uVar8) {
                  local_6f4 = (float)(long)uVar8;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(local_6f4 * 9.536743e-07),0),
                       local_3f8);
                local_418 = &local_2d8;
                local_410 = &local_278;
                local_408 = &local_288;
                local_400 = &local_3f8;
                in_stack_fffffffffffff8e8 = ggml_row_size(local_2d0,local_3f8);
                in_stack_fffffffffffff8e0 = local_3f8;
                in_stack_fffffffffffff8f0 = local_290;
                local_420 = in_stack_fffffffffffff8e8;
                std::function<float()>::function<main::__2&,void>
                          ((function<float_()> *)in_stack_fffffffffffff880._M_current,
                           (anon_class_32_4_aacd4656 *)__f);
                benchmark_function(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                   in_stack_fffffffffffff8e0,
                                   (function<float_()> *)
                                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
                std::function<float_()>::~function((function<float_()> *)0x108e75);
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_3e8);
              }
              printf("\n");
            }
            if ((local_1d & 1) != 0) {
              printf("  quantize_row_q_dot\n");
              local_448 = local_40;
              local_450._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT44(uVar10,uVar9));
              local_458 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(uVar10,uVar9));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(uVar10,uVar9)), bVar2) {
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_450);
                local_460 = *puVar7;
                uVar8 = local_460 << 2;
                in_stack_fffffffffffff8d8 = (float)(long)uVar8;
                in_stack_fffffffffffff8dc = (float)(uVar8 >> 1) + (float)(uVar8 >> 1);
                if (-1 < (long)uVar8) {
                  in_stack_fffffffffffff8dc = in_stack_fffffffffffff8d8;
                }
                printf("    %zu values (%.2f MB)\n",
                       SUB84((double)(in_stack_fffffffffffff8dc * 9.536743e-07),0),local_460);
                local_480 = &local_2e0;
                local_478 = local_268;
                local_470 = &local_278;
                local_468 = &local_460;
                local_488 = ggml_row_size(local_2d0,local_460);
                std::function<float()>::function<main::__3&,void>
                          ((function<float_()> *)in_stack_fffffffffffff880._M_current,
                           (anon_class_32_4_0d8592bc *)__f);
                benchmark_function(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                   in_stack_fffffffffffff8e0,
                                   (function<float_()> *)
                                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
                std::function<float_()>::~function((function<float_()> *)0x10908f);
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_450);
              }
              printf("\n");
            }
            if ((local_1c & 1) != 0) {
              printf("  vec_dot_q\n");
              (*(code *)*local_2e0)(local_268[0],local_278,local_1c0);
              (*(code *)*local_2e0)(local_270,local_280,local_1c0);
              local_4b0 = local_40;
              local_4b8._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT44(uVar10,uVar9));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(uVar10,uVar9));
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                        (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)CONCAT44(uVar10,uVar9)), bVar2) {
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_4b8);
                in_stack_fffffffffffff880._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
                uVar8 = (long)in_stack_fffffffffffff880._M_current << 2;
                fVar11 = (float)(uVar8 >> 1) + (float)(uVar8 >> 1);
                if (-1 < (long)uVar8) {
                  fVar11 = (float)(long)uVar8;
                }
                printf("    %zu values (%.2f MB)\n",SUB84((double)(fVar11 * 9.536743e-07),0),
                       in_stack_fffffffffffff880._M_current);
                in_stack_fffffffffffff888._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ggml_row_size(local_2d0,in_stack_fffffffffffff880._M_current);
                std::function<float()>::function<main::__4&,void>
                          ((function<float_()> *)in_stack_fffffffffffff880._M_current,
                           (anon_class_32_4_7807d5e0 *)__f);
                benchmark_function(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                   in_stack_fffffffffffff8e0,
                                   (function<float_()> *)
                                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
                std::function<float_()>::~function((function<float_()> *)0x1092f7);
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_4b8);
              }
              printf("\n");
            }
          }
        }
        ggml_free(local_2b0);
        local_4 = 0;
        local_128 = 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff880._M_current);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff880._M_current);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff880._M_current);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff880._M_current);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff880._M_current);
      }
      else {
        uVar4 = std::__cxx11::string::c_str();
        fprintf(pFVar1,"error: invalid parameter for argument: %s\n",uVar4);
        local_4 = 1;
        local_128 = 1;
      }
LAB_00109406:
      std::__cxx11::string::~string(local_80);
      quantize_perf_params::~quantize_perf_params
                ((quantize_perf_params *)
                 CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870));
      return local_4;
    }
    std::__cxx11::string::operator=(local_80,*(char **)(local_10 + (long)local_84 * 8));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                            (char *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
    if (bVar2) {
      local_84 = local_84 + 1;
      if (local_8 <= local_84) {
        local_59 = 1;
        goto LAB_00108018;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8b0,
                 (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                 in_stack_fffffffffffff8a0);
      iVar3 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),0);
      uVar8 = (ulong)iVar3;
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      local_a0 = uVar8;
      if ((uVar8 & 0x1f) != 0) {
        fprintf(_stderr,"error: size %zu not divisible by 32\n",uVar8);
        local_59 = 1;
        goto LAB_00108018;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff880._M_current,in_stack_fffffffffffff878._M_current);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                              (char *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868))
      ;
      if (bVar2) {
        local_d0 = 0x1000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        local_d8 = 0x10000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        local_e0 = 0xa0000;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                   (value_type_conflict *)
                   CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                                (char *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868
                                                ));
        if (bVar2) {
          local_e8 = 0x1000;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
          local_f0 = 0x10000;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
          local_f8 = 0xa0000;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
          local_100 = 0x3e80000;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                     (value_type_conflict *)
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                                  (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                   in_stack_fffffffffffff868));
          if (bVar2) {
            local_84 = local_84 + 1;
            if (local_8 <= local_84) {
              local_59 = 1;
              goto LAB_00108018;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff8b0,
                       (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                       in_stack_fffffffffffff8a0);
            std::allocator<char>::~allocator(&local_121);
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                                    ,(char *)CONCAT44(in_stack_fffffffffffff86c,
                                                      in_stack_fffffffffffff868));
            if (bVar2) {
              local_20 = 1;
LAB_00107a86:
              local_128 = 0;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff874,
                                                  in_stack_fffffffffffff870),
                                      (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                       in_stack_fffffffffffff868));
              if (bVar2) {
                local_1f = 1;
                goto LAB_00107a86;
              }
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff874,
                                                  in_stack_fffffffffffff870),
                                      (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                       in_stack_fffffffffffff868));
              if (bVar2) {
                local_1e = 1;
                goto LAB_00107a86;
              }
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff874,
                                                  in_stack_fffffffffffff870),
                                      (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                       in_stack_fffffffffffff868));
              if (bVar2) {
                local_1d = 1;
                goto LAB_00107a86;
              }
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff874,
                                                  in_stack_fffffffffffff870),
                                      (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                       in_stack_fffffffffffff868));
              if (bVar2) {
                local_1c = 1;
                goto LAB_00107a86;
              }
              local_59 = 1;
              local_128 = 2;
            }
            std::__cxx11::string::~string(local_120);
            if (local_128 != 0) goto LAB_00108018;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                                    ,(char *)CONCAT44(in_stack_fffffffffffff86c,
                                                      in_stack_fffffffffffff868));
            if (bVar2) {
              local_84 = local_84 + 1;
              if (local_8 <= local_84) {
                local_59 = 1;
                goto LAB_00108018;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff8b0,
                         (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                         in_stack_fffffffffffff8a0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
              std::__cxx11::string::~string(local_148);
              std::allocator<char>::~allocator(&local_149);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff874,
                                                  in_stack_fffffffffffff870),
                                      (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                       in_stack_fffffffffffff868));
              if (bVar2) {
                local_84 = local_84 + 1;
                if (local_8 <= local_84) {
                  local_59 = 1;
                  goto LAB_00108018;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff8b0,
                           (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                           in_stack_fffffffffffff8a0);
                iVar3 = std::__cxx11::stoi((string *)
                                           CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff86c,
                                                    in_stack_fffffffffffff868),0);
                std::__cxx11::string::~string(local_170);
                std::allocator<char>::~allocator(&local_171);
                local_150 = iVar3;
                if ((iVar3 < 0) || (0x40 < iVar3)) {
                  fprintf(_stderr,"error: alignment-offset must be less than %d\n",0x40);
                  local_59 = 1;
                  goto LAB_00108018;
                }
                local_28 = (long)iVar3;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                        (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                         in_stack_fffffffffffff868));
                if ((!bVar2) &&
                   (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffff874,
                                                        in_stack_fffffffffffff870),
                                            (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                             in_stack_fffffffffffff868)), !bVar2)) {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffff874,
                                                      in_stack_fffffffffffff870),
                                          (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                           in_stack_fffffffffffff868));
                  if ((bVar2) ||
                     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_fffffffffffff874,
                                                          in_stack_fffffffffffff870),
                                              (char *)CONCAT44(in_stack_fffffffffffff86c,
                                                               in_stack_fffffffffffff868)),
                     pFVar1 = _stderr, bVar2)) {
                    usage((char **)in_stack_fffffffffffff880._M_current);
                    local_4 = 1;
                    local_128 = 1;
                  }
                  else {
                    uVar4 = std::__cxx11::string::c_str();
                    fprintf(pFVar1,"error: unknown argument: %s\n",uVar4);
                    local_4 = 1;
                    local_128 = 1;
                  }
                  goto LAB_00109406;
                }
                local_84 = local_84 + 1;
                if (local_8 <= local_84) {
                  local_59 = 1;
                  goto LAB_00108018;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff8b0,
                           (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                           in_stack_fffffffffffff8a0);
                iVar3 = std::__cxx11::stoi((string *)
                                           CONCAT44(in_stack_fffffffffffff874,
                                                    in_stack_fffffffffffff870),
                                           (size_t *)
                                           CONCAT44(in_stack_fffffffffffff86c,
                                                    in_stack_fffffffffffff868),0);
                std::__cxx11::string::~string(local_198);
                std::allocator<char>::~allocator(&local_199);
                local_178 = iVar3;
                if ((iVar3 < 0) || (100000000 < iVar3)) {
                  fprintf(_stderr,"error: iterations must be less than %d\n",100000000);
                  local_59 = 1;
                  goto LAB_00108018;
                }
                local_18 = (size_t)iVar3;
              }
            }
          }
        }
      }
    }
    local_84 = local_84 + 1;
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    quantize_perf_params params {};

    // read command line

    bool invalid_param = false;
    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "--size") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            size_t size = std::stoi(argv[i]);
            if (size % 32 != 0) {
                fprintf(stderr, "error: size %zu not divisible by 32\n", size);
                invalid_param = true;
                break;
            }
            params.test_sizes.push_back(size);
        } else if (arg == "-3") {
            // quick select sizes that probably fit in CPU caches
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
        } else if (arg == "-4") {
            // quick select cache sizes + memory
            params.test_sizes.push_back(L1_SIZE);
            params.test_sizes.push_back(L2_SIZE);
            params.test_sizes.push_back(L3_SIZE);
            params.test_sizes.push_back(MEM_SIZE);
        } else if (arg == "--op") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            std::string op {argv[i]};
            if (op == "quantize_row_q_reference") {
                params.op_quantize_row_q_reference = true;
            } else if (op == "quantize_row_q") {
                params.op_quantize_row_q = true;
            } else if (op == "dequantize_row_q") {
                params.op_dequantize_row_q = true;
            } else if (op == "quantize_row_q_dot") {
                params.op_quantize_row_q_dot = true;
            } else if (op == "vec_dot_q") {
                params.op_vec_dot_q = true;
            } else {
                invalid_param = true;
                break;
            }
        } else if (arg == "--type") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            params.include_types.push_back(argv[i]);
        } else if (arg == "--alignment-offset") {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int alignment = std::stoi(argv[i]);
            if (alignment < 0 || alignment > MAX_ALIGNMENT) {
            fprintf(stderr, "error: alignment-offset must be less than %d\n", MAX_ALIGNMENT);
                invalid_param = true;
                break;
            }
            params.alignment_offset = alignment;
        } else if ((arg == "-i") || (arg == "--iterations")) {
            if (++i >= argc) {
                invalid_param = true;
                break;
            }
            int number = std::stoi(argv[i]);
            if (number < 0 || number > MAX_ITERATIONS) {
            fprintf(stderr, "error: iterations must be less than %d\n", MAX_ITERATIONS);
                invalid_param = true;
                break;
            }
            params.iterations = number;
        } else if ((arg == "-h") || (arg == "--help")) {
            usage(argv);
            return 1;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }
    if (invalid_param) {
        fprintf(stderr, "error: invalid parameter for argument: %s\n", arg.c_str());
        return 1;
    }

    if (params.test_sizes.empty()) {
        params.test_sizes.push_back(L1_SIZE);
    }
    if (!(params.op_quantize_row_q_reference || params.op_quantize_row_q || params.op_dequantize_row_q || params.op_quantize_row_q_dot || params.op_vec_dot_q)) {
        params.op_quantize_row_q_reference = params.op_quantize_row_q = params.op_dequantize_row_q = params.op_quantize_row_q_dot = params.op_vec_dot_q = true;
    }

    std::sort(params.test_sizes.begin(), params.test_sizes.end());
    size_t largest = params.test_sizes.back();

    std::vector<uint8_t> test_data1_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_data2_v(largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q1_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_q2_v   (largest*4 + MAX_ALIGNMENT*2);
    std::vector<uint8_t> test_out_v  (largest*4 + MAX_ALIGNMENT*2);

    float * test_data1 = (float *) align_with_offset(test_data1_v.data(), params.alignment_offset);
    float * test_data2 = (float *) align_with_offset(test_data2_v.data(), params.alignment_offset);
    float * test_q1    = (float *) align_with_offset(test_q1_v.data(),    params.alignment_offset);
    float * test_q2    = (float *) align_with_offset(test_q2_v.data(),    params.alignment_offset);
    float * test_out   = (float *) align_with_offset(test_out_v.data(),   params.alignment_offset);

    generate_data(0, largest, test_data1);
    generate_data(1, largest, test_data2);

    int64_t iterations = params.iterations;


    // Initialize GGML, ensures float conversion tables are initialized
    struct ggml_init_params ggml_params = {
        /* .mem_size   = */ 1*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ true,
    };
    struct ggml_context * ctx = ggml_init(ggml_params);

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);
        if (!params.include_types.empty() && ggml_type_name(type) && std::find(params.include_types.begin(), params.include_types.end(), ggml_type_name(type)) == params.include_types.end()) {
            continue;
        }

        if (qfns_cpu->from_float && qfns->to_float) {
            printf("%s\n", ggml_type_name(type));

            ggml_quantize_init(type);

            if (params.op_quantize_row_q_reference) {
                printf("  quantize_row_q_reference\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->from_float_ref(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q) {
                printf("  quantize_row_q\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns_cpu->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_dequantize_row_q) {
                printf("  dequantize_row_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        qfns->to_float(test_q1, test_out, size);
                        return test_out[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_quantize_row_q_dot) {
                printf("  quantize_row_q_dot\n");
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        const auto * vdot = ggml_get_type_traits_cpu(qfns_cpu->vec_dot_type);
                        vdot->from_float(test_data1, test_q1, size);
                        return test_q1[0];
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }

            if (params.op_vec_dot_q) {
                printf("  vec_dot_q\n");
                qfns_cpu->from_float(test_data1, test_q1, largest);
                qfns_cpu->from_float(test_data2, test_q2, largest);
                for (size_t size : params.test_sizes) {
                    printf("    %zu values (%.2f MB)\n", size, 4*size/(float)(1024*1024));
                    auto quantize_fn = [&](void) -> float {
                        float result;
                        qfns_cpu->vec_dot(size, &result, 0, test_q1, 0, test_q2, 0, 1);
                        return result;
                    };
                    size_t quantized_size = ggml_row_size(type, size);
                    benchmark_function(size, quantized_size, iterations, quantize_fn);
                }
                printf("\n");
            }
        }
    }

    ggml_free(ctx);

    return 0;
}